

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

int ebur128_loudness_window(ebur128_state *st,unsigned_long window,double *out)

{
  int iVar1;
  double dVar2;
  double energy;
  
  if (st->d->window < window) {
    iVar1 = 2;
  }
  else {
    iVar1 = ebur128_energy_in_interval(st,(window * st->samplerate) / 1000,&energy);
    if (iVar1 == 0) {
      if (energy <= 0.0) {
        dVar2 = -INFINITY;
      }
      else {
        dVar2 = ebur128_energy_to_loudness(energy);
      }
      *out = dVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ebur128_loudness_window(ebur128_state* st,
                            unsigned long window,
                            double* out) {
  double energy;
  size_t interval_frames;
  int error;

  if (window > st->d->window) {
    return EBUR128_ERROR_INVALID_MODE;
  }

  interval_frames = st->samplerate * window / 1000;
  error = ebur128_energy_in_interval(st, interval_frames, &energy);
  if (error) {
    return error;
  }

  if (energy <= 0.0) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  *out = ebur128_energy_to_loudness(energy);
  return EBUR128_SUCCESS;
}